

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * basicgetobjname(Proto *p,int *ppc,int reg,char **name)

{
  Instruction *pIVar1;
  long lVar2;
  char *pcVar3;
  long *plVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  
  iVar6 = *ppc;
  pcVar3 = luaF_getlocalname(p,reg + 1,iVar6);
  *name = pcVar3;
  if (pcVar3 != (char *)0x0) {
    return "local";
  }
  pIVar1 = p->code;
  uVar9 = ((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar1[iVar6] & 0x7f] >> 7) + iVar6;
  if (uVar9 == 0 ||
      SCARRY4((int)((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar1[iVar6] & 0x7f] >> 7),iVar6) !=
      (int)uVar9 < 0) {
    iVar6 = -1;
  }
  else {
    uVar10 = 0;
    uVar8 = 0xffffffff;
    iVar11 = 0;
    do {
      uVar7 = pIVar1[uVar10];
      uVar16 = uVar7 & 0x7f;
      uVar13 = uVar7 >> 7 & 0xff;
      if (uVar16 < 0x44) {
        if (uVar16 == 8) {
          if ((int)uVar13 <= reg) {
            bVar12 = reg <= (int)(uVar13 + (uVar7 >> 0x10 & 0xff));
            goto LAB_001400b9;
          }
        }
        else {
          if (uVar16 != 0x38) goto LAB_0014008e;
          iVar14 = (int)uVar10 + (uVar7 >> 7) + -0xfffffe;
          iVar6 = iVar11;
          if (iVar11 < iVar14) {
            iVar6 = iVar14;
          }
          if (iVar14 <= (int)uVar9) {
            iVar11 = iVar6;
          }
        }
        bVar12 = false;
      }
      else {
        if (1 < uVar16 - 0x44) {
          if (uVar16 != 0x4c) {
LAB_0014008e:
            bVar12 = (bool)(uVar13 == reg & ("\b\n\n\t\t\b\b\b\b\b"[uVar16] & 8) >> 3);
            goto LAB_001400b9;
          }
          uVar13 = uVar13 + 2;
        }
        bVar12 = (int)uVar13 <= reg;
      }
LAB_001400b9:
      uVar15 = 0xffffffff;
      if ((long)iVar11 <= (long)uVar10) {
        uVar15 = uVar10 & 0xffffffff;
      }
      if (bVar12 != false) {
        uVar8 = uVar15;
      }
      iVar6 = (int)uVar8;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  *ppc = iVar6;
  if (iVar6 == -1) goto LAB_001401c0;
  uVar9 = pIVar1[iVar6];
  pcVar3 = (char *)(ulong)(uVar9 & 0x7f);
  bVar12 = true;
  switch(pcVar3) {
  case (char *)0x0:
    pcVar3 = (char *)0xff;
    uVar7 = uVar9 >> 0x10 & 0xff;
    bVar12 = (uVar9 >> 7 & 0xff) <= uVar7;
    if (!bVar12) {
      pcVar3 = basicgetobjname(p,ppc,uVar7,name);
    }
    break;
  case (char *)0x3:
    uVar8 = (ulong)(uVar9 >> 0xb & 0xfffffff0);
    if (((&p->k->tt_)[uVar8] & 0xf) != 4) goto LAB_0014017e;
    plVar4 = (long *)((long)&p->k->value_ + uVar8);
LAB_0014016e:
    pcVar5 = (char *)(*plVar4 + 0x18);
    pcVar3 = "constant";
    goto LAB_00140187;
  case (char *)0x4:
    uVar8 = (ulong)(pIVar1[(long)iVar6 + 1] >> 3 & 0xfffffff0);
    if (((&p->k->tt_)[uVar8] & 0xf) == 4) {
      plVar4 = (long *)((long)&p->k->value_ + uVar8);
      goto LAB_0014016e;
    }
LAB_0014017e:
    pcVar5 = "?";
    pcVar3 = (char *)0x0;
LAB_00140187:
    *name = pcVar5;
LAB_001401b9:
    bVar12 = false;
    break;
  case (char *)0x9:
    lVar2 = *(long *)((long)&p->upvalues->name + (ulong)(uVar9 >> 0xc & 0xff0));
    pcVar3 = "?";
    if (lVar2 != 0) {
      pcVar3 = (char *)(lVar2 + 0x18);
    }
    *name = pcVar3;
    pcVar3 = "upvalue";
    goto LAB_001401b9;
  }
  if (bVar12) {
LAB_001401c0:
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

static const char *basicgetobjname (const Proto *p, int *ppc, int reg,
                                    const char **name) {
  int pc = *ppc;
  *name = luaF_getlocalname(p, reg + 1, pc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  *ppc = pc = findsetreg(p, pc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return basicgetobjname(p, ppc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK: return kname(p, GETARG_Bx(i), name);
      case OP_LOADKX: return kname(p, GETARG_Ax(p->code[pc + 1]), name);
      default: break;
    }
  }
  return NULL;  /* could not find reasonable name */
}